

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandLines.cxx
# Opt level: O0

cmCustomCommandLine *
cmMakeCommandLine(cmCustomCommandLine *__return_storage_ptr__,
                 initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist)

{
  size_type __n;
  const_iterator pbVar1;
  undefined1 auStack_68 [8];
  string_view cmd;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *__range1;
  undefined1 local_20 [8];
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist_local;
  cmCustomCommandLine *commandLine;
  
  ilist_local._M_array = (iterator)ilist._M_len;
  local_20 = (undefined1  [8])ilist._M_array;
  ilist_local._M_len = (size_type)__return_storage_ptr__;
  cmCustomCommandLine::cmCustomCommandLine(__return_storage_ptr__);
  __n = std::initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_>::size
                  ((initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                   local_20);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&__return_storage_ptr__->
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ,__n);
  __end1 = std::initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_>::begin
                     ((initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                      local_20);
  pbVar1 = std::initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_>::end
                     ((initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                      local_20);
  for (; __end1 != pbVar1; __end1 = __end1 + 1) {
    auStack_68 = (undefined1  [8])__end1->_M_len;
    cmd._M_len = (size_t)__end1->_M_str;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)auStack_68
              );
  }
  return __return_storage_ptr__;
}

Assistant:

cmCustomCommandLine cmMakeCommandLine(
  std::initializer_list<cm::string_view> ilist)
{
  cmCustomCommandLine commandLine;
  commandLine.reserve(ilist.size());
  for (cm::string_view cmd : ilist) {
    commandLine.emplace_back(cmd);
  }
  return commandLine;
}